

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O2

void __thiscall TempSpace::TempSpace(TempSpace *this,uchar **strs,size_t n)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  
  this->strings = (cacheblock_t *)0x0;
  this->allocated = (cacheblock_t *)0x0;
  this->elements_in_strings = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"TempSpace::TempSpace(unsigned char **, size_t)");
  std::operator<<(poVar1,"\n");
  uVar2 = n * 8;
  uVar3 = (ulong)strs & 0xf;
  if (uVar3 != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"\t: alignment mismatch by ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"bytes\n");
    strs = (uchar **)((long)strs + uVar3);
    uVar2 = uVar2 - uVar3;
  }
  if ((uVar2 & 0xf) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"\t: truncate by ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"bytes\n");
  }
  this->strings = (cacheblock_t *)strs;
  this->elements_in_strings = uVar2 >> 4;
  return;
}

Assistant:

TempSpace(unsigned char** strs, size_t n)
		: strings(0), allocated(0), elements_in_strings(0)
	{
		debug()<<__PRETTY_FUNCTION__<<"\n";
		char* raw = reinterpret_cast<char*>(strs);
		size_t rawbytes = n*sizeof(unsigned char*);
		if (std::ptrdiff_t(raw) % sizeof(cacheblock_t)) {
			unsigned diff = std::ptrdiff_t(raw) % sizeof(cacheblock_t);
			debug()<<"\t: alignment mismatch by "<<diff<<"bytes\n";
			raw      += diff;
			rawbytes -= diff;
		}
		if (rawbytes % sizeof(cacheblock_t)) {
			unsigned diff = rawbytes % sizeof(cacheblock_t);
			debug()<<"\t: truncate by "<<diff<<"bytes\n";
			rawbytes -= diff;
		}
		strings = reinterpret_cast<cacheblock_t*>(raw);
		elements_in_strings = rawbytes / sizeof(cacheblock_t);
	}